

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_ray_hit_info *
rf_collision_ray_ground(rf_ray_hit_info *__return_storage_ptr__,rf_ray ray,float ground_height)

{
  float fVar1;
  
  *(undefined8 *)&(__return_storage_ptr__->position).z = 0;
  (__return_storage_ptr__->normal).y = 0.0;
  (__return_storage_ptr__->normal).z = 0.0;
  __return_storage_ptr__->hit = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
  __return_storage_ptr__->distance = 0.0;
  (__return_storage_ptr__->position).x = 0.0;
  (__return_storage_ptr__->position).y = 0.0;
  if (1e-06 < ABS(ray.direction.y)) {
    fVar1 = (ray.position.y - ground_height) / -ray.direction.y;
    if (0.0 <= fVar1) {
      __return_storage_ptr__->hit = true;
      __return_storage_ptr__->distance = fVar1;
      (__return_storage_ptr__->normal).y = 1.0;
      (__return_storage_ptr__->position).x = fVar1 * ray.direction.x + ray.position.x;
      (__return_storage_ptr__->position).y = fVar1 * ray.direction.y + ray.position.y;
      (__return_storage_ptr__->position).z = ray.direction.z * fVar1 + ray.position.z;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_ray_hit_info rf_collision_ray_ground(rf_ray ray, float ground_height)
{
#define rf_epsilon 0.000001 // Just a small number

    rf_ray_hit_info result = {0};

    if (fabs(ray.direction.y) > rf_epsilon)
    {
        float distance = (ray.position.y - ground_height) / -ray.direction.y;

        if (distance >= 0.0)
        {
            result.hit = true;
            result.distance = distance;
            result.normal = (rf_vec3) {0.0, 1.0, 0.0};
            result.position = rf_vec3_add(ray.position, rf_vec3_scale(ray.direction, distance));
        }
    }

    return result;
}